

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

item<mpt::layout::graph::data> * __thiscall
mpt::item_array<mpt::layout::graph::data>::append
          (item_array<mpt::layout::graph::data> *this,data *t,char *id,int len)

{
  content<mpt::item<mpt::layout::graph::data>_> *pcVar1;
  data *pdVar2;
  bool bVar3;
  item<mpt::layout::graph::data> *piVar4;
  ulong pos;
  
  pcVar1 = (this->super_unique_array<mpt::item<mpt::layout::graph::data>_>)._ref._ref;
  if (pcVar1 == (content<mpt::item<mpt::layout::graph::data>_> *)0x0) {
    pos = 0;
  }
  else {
    pos = (pcVar1->super_buffer)._used >> 5;
  }
  piVar4 = unique_array<mpt::item<mpt::layout::graph::data>_>::insert
                     (&this->super_unique_array<mpt::item<mpt::layout::graph::data>_>,pos);
  if (piVar4 == (item<mpt::layout::graph::data> *)0x0) {
LAB_00135c10:
    piVar4 = (item<mpt::layout::graph::data> *)0x0;
  }
  else {
    if (id != (char *)0x0) {
      bVar3 = identifier::set_name(&piVar4->super_identifier,id,len);
      if (!bVar3) {
        unique_array<mpt::item<mpt::layout::graph::data>_>::resize
                  (&this->super_unique_array<mpt::item<mpt::layout::graph::data>_>,pos);
        goto LAB_00135c10;
      }
    }
    pdVar2 = (piVar4->super_reference<mpt::layout::graph::data>)._ref;
    if (pdVar2 != (data *)0x0) {
      (**pdVar2->_vptr_data)();
    }
    (piVar4->super_reference<mpt::layout::graph::data>)._ref = t;
  }
  return piVar4;
}

Assistant:

inline ~reference()
	{
		if (_ref) _ref->unref();
	}